

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::createSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,TestParameters params)

{
  InstanceDriver *vki;
  TestStatus *pTVar1;
  long lVar2;
  Type wsiType;
  long lVar3;
  undefined8 *puVar4;
  VkSwapchainCreateInfoKHR *pVVar5;
  ulong uVar6;
  byte bVar7;
  vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> cases;
  NativeObjects native;
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  VkSwapchainCreateInfoKHR curParams;
  InstanceHelper instHelper;
  DeviceHelper devHelper;
  vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> local_940;
  NativeObjects local_928;
  VkSurfaceKHR local_908;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_900;
  VkDevice local_8f8;
  VkAllocationCallbacks *pVStack_8f0;
  TestStatus *local_8e0;
  Move<vk::Handle<(vk::HandleType)26>_> local_8d8;
  undefined1 local_8b8 [8];
  Deleter<vk::Handle<(vk::HandleType)26>_> aDStack_8b0 [4];
  ios_base local_840 [264];
  VkSwapchainCreateInfoKHR local_738;
  InstanceHelper local_6d0;
  undefined1 local_518 [16];
  VkInstance local_508;
  VkAllocationCallbacks *pVStack_500;
  VkAllocationCallbacks *local_4f8;
  DeviceDriver local_4f0;
  
  bVar7 = 0;
  wsiType = params.wsiType;
  InstanceHelper::InstanceHelper(&local_6d0,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_518._0_8_ = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_928,context,&local_6d0.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_518);
  vki = &local_6d0.vki;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_518,&vki->super_InstanceInterface,
             local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_928.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_928.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_8f8 = (VkDevice)local_508;
  pVStack_8f0 = pVStack_500;
  local_908.m_internal = local_518._0_8_;
  aStack_900 = (anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2)local_518._8_8_;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_518,context,&vki->super_InstanceInterface,
             local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_518._0_8_,(VkAllocationCallbacks *)0x0);
  local_8e0 = __return_storage_ptr__;
  generateSwapchainParameterCases
            (&local_940,wsiType,params.dimension,&vki->super_InstanceInterface,
             (VkPhysicalDevice)local_518._0_8_,local_908);
  if (local_940.
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_940.
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar6 = 0;
    do {
      puVar4 = (undefined8 *)
               ((long)&(local_940.
                        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                        ._M_impl.super__Vector_impl_data._M_start)->sType + lVar3);
      pVVar5 = &local_738;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined8 *)pVVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        pVVar5 = (VkSwapchainCreateInfoKHR *)((long)pVVar5 + (ulong)bVar7 * -0x10 + 8);
      }
      local_738.surface.m_internal = local_908.m_internal;
      local_738.queueFamilyIndexCount = 1;
      local_738.pQueueFamilyIndices = (deUint32 *)(local_518 + 8);
      local_8b8 = (undefined1  [8])context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_8b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_8b0,"Sub-case ",9);
      uVar6 = uVar6 + 1;
      std::ostream::_M_insert<unsigned_long>((ulong)aDStack_8b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_8b0," / ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)aDStack_8b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_8b0,": ",2);
      ::vk::operator<<((ostream *)aDStack_8b0,&local_738);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_8b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_8b0);
      std::ios_base::~ios_base(local_840);
      ::vk::createSwapchainKHR
                (&local_8d8,&local_4f0.super_DeviceInterface,(VkDevice)local_508,&local_738,
                 (VkAllocationCallbacks *)0x0);
      aDStack_8b0[0].m_device =
           local_8d8.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device;
      aDStack_8b0[0].m_allocator =
           local_8d8.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator;
      local_8b8 = (undefined1  [8])
                  local_8d8.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal;
      aDStack_8b0[0].m_deviceIface =
           local_8d8.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_deviceIface;
      if (local_8d8.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                  (aDStack_8b0,
                   (VkSwapchainKHR)
                   local_8d8.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal
                  );
      }
      lVar3 = lVar3 + 0x68;
    } while (uVar6 < (ulong)(((long)local_940.
                                    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_940.
                                    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  local_8b8 = (undefined1  [8])&aDStack_8b0[0].m_device;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b8,"Creating swapchain succeeded","");
  pTVar1 = local_8e0;
  local_8e0->m_code = QP_TEST_RESULT_PASS;
  (local_8e0->m_description)._M_dataplus._M_p = (pointer)&(local_8e0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8e0->m_description,local_8b8,
             (undefined1 *)
             ((long)local_8b8 + (long)&(aDStack_8b0[0].m_deviceIface)->_vptr_DeviceInterface));
  if (local_8b8 != (undefined1  [8])&aDStack_8b0[0].m_device) {
    operator_delete((void *)local_8b8,(ulong)(aDStack_8b0[0].m_device + 1));
  }
  if (local_940.
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_940.
                    super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_940.
                          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_940.
                          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DeviceDriver::~DeviceDriver(&local_4f0);
  if (local_508 != (VkInstance)0x0) {
    (*(code *)pVStack_500)(local_508,local_4f8);
  }
  local_508 = (VkInstance)0x0;
  pVStack_500 = (VkAllocationCallbacks *)0x0;
  local_4f8 = (VkAllocationCallbacks *)0x0;
  if (local_908.m_internal != 0) {
    (**(code **)(*(long *)aStack_900 + 0x68))
              (aStack_900.m_align,local_8f8,local_908.m_internal,pVStack_8f0);
  }
  if (local_928.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
      m_data.ptr != (Window *)0x0) {
    (*(local_928.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
       m_data.ptr)->_vptr_Window[1])();
    local_928.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
    ptr = (Window *)0x0;
  }
  if (local_928.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
      m_data.ptr != (Display *)0x0) {
    (*(local_928.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
       m_data.ptr)->_vptr_Display[1])();
    local_928.display.super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
    m_data.ptr = (Display *)0x0;
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_6d0.vki);
  if (local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
    (*local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  }
  local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
  local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_6d0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_6d0.supportedExtensions.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d0.supportedExtensions.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d0.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createSwapchainTest (Context& context, TestParameters params)
{
	const InstanceHelper					instHelper	(context, params.wsiType);
	const NativeObjects						native		(context, instHelper.supportedExtensions, params.wsiType);
	const Unique<VkSurfaceKHR>				surface		(createSurface(instHelper.vki, *instHelper.instance, params.wsiType, *native.display, *native.window));
	const DeviceHelper						devHelper	(context, instHelper.vki, *instHelper.instance, *surface);
	const vector<VkSwapchainCreateInfoKHR>	cases		(generateSwapchainParameterCases(params.wsiType, params.dimension, instHelper.vki, devHelper.physicalDevice, *surface));

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		VkSwapchainCreateInfoKHR	curParams	= cases[caseNdx];

		curParams.surface				= *surface;
		curParams.queueFamilyIndexCount	= 1u;
		curParams.pQueueFamilyIndices	= &devHelper.queueFamilyIndex;

		context.getTestContext().getLog()
			<< TestLog::Message << "Sub-case " << (caseNdx+1) << " / " << cases.size() << ": " << curParams << TestLog::EndMessage;

		{
			const Unique<VkSwapchainKHR>	swapchain	(createSwapchainKHR(devHelper.vkd, *devHelper.device, &curParams));
		}
	}

	return tcu::TestStatus::pass("Creating swapchain succeeded");
}